

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_ASCII85Decoder.cc
# Opt level: O2

void __thiscall
Pl_ASCII85Decoder::Pl_ASCII85Decoder(Pl_ASCII85Decoder *this,char *identifier,Pipeline *next)

{
  logic_error *this_00;
  
  Pipeline::Pipeline(&this->super_Pipeline,identifier,next);
  (this->super_Pipeline)._vptr_Pipeline = (_func_int **)&PTR__Pipeline_002ac180;
  builtin_memcpy(this->inbuf,"uuuuu",5);
  this->pos = 0;
  this->eod = 0;
  this->error = false;
  if (next != (Pipeline *)0x0) {
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,"Attempt to create Pl_ASCII85Decoder with nullptr as next");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

Pl_ASCII85Decoder::Pl_ASCII85Decoder(char const* identifier, Pipeline* next) :
    Pipeline(identifier, next)
{
    if (!next) {
        throw std::logic_error("Attempt to create Pl_ASCII85Decoder with nullptr as next");
    }
}